

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

Bool prvTidyelementIsAutonomousCustomFormat(ctmbstr element)

{
  char *pcVar1;
  
  if (element != (ctmbstr)0x0) {
    pcVar1 = strchr(element,0x2d);
    if (pcVar1 != (char *)0x0 && 0 < (long)pcVar1 - (long)element) {
      return yes;
    }
  }
  return no;
}

Assistant:

Bool TY_(elementIsAutonomousCustomFormat)( ctmbstr element )
{
    if ( element )
    {
        const char *ptr = strchr(element, '-');

        /* Tag must contain hyphen not in first character. */
        if ( ptr && (ptr - element > 0) )
        {
            return yes;
        }
    }

    return no;
}